

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

void Ivy_FastMapMark_rec(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  iVar1 = Ivy_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x462,"void Ivy_FastMapMark_rec(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    pIVar2 = Ivy_ObjFanin0(pObj);
    Ivy_FastMapMark_rec(pAig,pIVar2);
    pIVar2 = Ivy_ObjFanin1(pObj);
    Ivy_FastMapMark_rec(pAig,pIVar2);
    Ivy_ObjSetTravIdCurrent(pAig,pObj);
  }
  return;
}

Assistant:

void Ivy_FastMapMark_rec( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    if ( Ivy_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_FastMapMark_rec( pAig, Ivy_ObjFanin0(pObj) );
    Ivy_FastMapMark_rec( pAig, Ivy_ObjFanin1(pObj) );
    Ivy_ObjSetTravIdCurrent(pAig, pObj);
}